

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cMultiBindTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::MultiBind::ErrorsBindSamplersTest::iterate(ErrorsBindSamplersTest *this)

{
  char cVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestContext *pTVar5;
  TestLog *pTVar6;
  MessageBuilder *pMVar7;
  TestError *pTVar8;
  Enum<int,_2UL> EVar9;
  exception *anon_var_0;
  Enum<int,_2UL> local_3f8;
  GetNameFunc local_3e8;
  int local_3e0;
  Enum<int,_2UL> local_3d8;
  int local_3c4;
  MessageBuilder local_3c0;
  int local_23c;
  undefined8 uStack_238;
  GLenum generated_error_1;
  GLuint t_sampler_ids [4];
  Enum<int,_2UL> local_218;
  GetNameFunc local_208;
  int local_200;
  Enum<int,_2UL> local_1f8;
  int local_1e4;
  MessageBuilder local_1e0;
  int local_60;
  GLenum generated_error;
  int local_50;
  int local_4c;
  GLuint t_first;
  GLsizei t_count;
  GLuint sampler_ids [4];
  long local_30;
  size_t validated_index;
  GLint max_samplers;
  GLuint invalid_id;
  GLuint first;
  GLsizei count;
  Functions *gl;
  ErrorsBindSamplersTest *this_local;
  
  gl = (Functions *)this;
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  _first = CONCAT44(extraout_var,iVar2);
  invalid_id = 4;
  max_samplers = 0;
  validated_index._4_4_ = 1;
  validated_index._0_4_ = 0;
  local_30 = 3;
  (**(code **)(_first + 0x868))(0x8b4d,&validated_index);
  dVar3 = (**(code **)(_first + 0x800))();
  glu::checkError(dVar3,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0x7b0);
  if ((int)(GLuint)validated_index < 4) {
    invalid_id = (GLuint)validated_index;
    local_30 = (long)(int)((GLuint)validated_index - 1);
  }
  (**(code **)(_first + 0x6f0))(4,&t_first);
  dVar3 = (**(code **)(_first + 0x800))();
  glu::checkError(dVar3,"GenSamplers",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0x7c0);
  local_4c = 4;
  local_50 = 0;
  if ((int)(GLuint)validated_index < 4) {
    local_4c = (GLuint)validated_index + 1;
  }
  else {
    local_50 = (GLuint)validated_index - 3;
  }
  (**(code **)(_first + 0xb0))(local_50,local_4c,&t_first);
  local_60 = (**(code **)(_first + 0x800))();
  if (local_60 != 0x502) {
    pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar6 = tcu::TestContext::getLog(pTVar5);
    tcu::TestLog::operator<<(&local_1e0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<(&local_1e0,(char (*) [7])0x2a372b5);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (pMVar7,(char (*) [128])
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                       );
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [9])", line: ");
    local_1e4 = 0x7d6;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_1e4);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [20])". Got wrong error: ");
    EVar9 = glu::getErrorStr(local_60);
    local_208 = EVar9.m_getName;
    local_200 = EVar9.m_value;
    local_1f8.m_getName = local_208;
    local_1f8.m_value = local_200;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_1f8);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [13])0x2a22899);
    EVar9 = glu::getErrorStr(0x502);
    t_sampler_ids._8_8_ = EVar9.m_getName;
    local_218.m_value = EVar9.m_value;
    local_218.m_getName = (GetNameFunc)t_sampler_ids._8_8_;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_218);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])", message: ");
    pMVar7 = tcu::MessageBuilder::operator<<
                       (pMVar7,(char (*) [44])"BindSamplers with invalid <first> + <count>");
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1e0);
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
               ,0x7d6);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  uStack_238 = _t_first;
  t_sampler_ids[0] = sampler_ids[0];
  t_sampler_ids[1] = sampler_ids[1];
  local_60 = 0x502;
  while( true ) {
    cVar1 = (**(code **)(_first + 0xcc8))(validated_index._4_4_);
    if (cVar1 != '\x01') break;
    validated_index._4_4_ = validated_index._4_4_ + 1;
  }
  *(int *)((long)&stack0xfffffffffffffdc8 + local_30 * 4) = validated_index._4_4_;
  (**(code **)(_first + 200))(max_samplers,invalid_id,&stack0xfffffffffffffdc8);
  local_23c = (**(code **)(_first + 0x800))();
  if (local_23c != 0x502) {
    pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar6 = tcu::TestContext::getLog(pTVar5);
    tcu::TestLog::operator<<(&local_3c0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<(&local_3c0,(char (*) [7])0x2a372b5);
    pMVar7 = tcu::MessageBuilder::operator<<
                       (pMVar7,(char (*) [128])
                               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                       );
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [9])", line: ");
    local_3c4 = 0x7f1;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_3c4);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [20])". Got wrong error: ");
    EVar9 = glu::getErrorStr(local_23c);
    local_3e8 = EVar9.m_getName;
    local_3e0 = EVar9.m_value;
    local_3d8.m_getName = local_3e8;
    local_3d8.m_value = local_3e0;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_3d8);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [13])0x2a22899);
    EVar9 = glu::getErrorStr(0x502);
    local_3f8.m_getName = EVar9.m_getName;
    local_3f8.m_value = EVar9.m_value;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_3f8);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [12])", message: ");
    pMVar7 = tcu::MessageBuilder::operator<<
                       (pMVar7,(char (*) [37])"BindSamplers with invalid sampler id");
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_3c0);
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
               ,0x7f1);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(_first + 0x468))(4);
  pTVar5 = deqp::Context::getTestContext((this->super_TestCase).m_context);
  tcu::TestContext::setTestResult(pTVar5,QP_TEST_RESULT_PASS,"Pass");
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult ErrorsBindSamplersTest::iterate()
{
	static const GLsizei n_samplers = 4;

	const Functions& gl = m_context.getRenderContext().getFunctions();

#if DEBUG_ENBALE_MESSAGE_CALLBACK
	gl.debugMessageCallback(debug_proc, &m_context);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DebugMessageCallback");
#endif /* DEBUG_ENBALE_MESSAGE_CALLBACK */

	GLsizei count			= n_samplers;
	GLuint  first			= 0;
	GLuint  invalid_id		= 1; /* Start with 1, as 0 is not valid name */
	GLint   max_samplers	= 0;
	size_t  validated_index = n_samplers - 1;

	/* Get max */
	gl.getIntegerv(GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS, &max_samplers);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	/* Select count so <first + count> does not exceed max.
	 * Validated index shall be in the specified range.
	 */
	if (n_samplers > max_samplers)
	{
		count			= max_samplers;
		validated_index = max_samplers - 1;
	}

	/* Storage */
	GLuint sampler_ids[n_samplers];

	/* Prepare samplers */
	gl.genSamplers(n_samplers, sampler_ids);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GenSamplers");

	try
	{
		/* - INVALID_OPERATION when <first> + <count> exceed limits; */
		{
			GLsizei t_count = n_samplers;
			GLuint  t_first = 0;

			/* Select first so <first + count> exceeds max, avoid negative first */
			if (n_samplers <= max_samplers)
			{
				t_first = max_samplers - n_samplers + 1;
			}
			else
			{
				t_count = max_samplers + 1;
				/* first = 0; */
			}

			/* Test */
			gl.bindSamplers(t_first, t_count, sampler_ids);
			CHECK_ERROR(GL_INVALID_OPERATION, "BindSamplers with invalid <first> + <count>");
		}

		/* - INVALID_OPERATION if any value in <buffers> is not zero or the name of
		 * existing buffer;
		 */
		{
			GLuint t_sampler_ids[n_samplers];

			memcpy(t_sampler_ids, sampler_ids, sizeof(sampler_ids));

			/* Find invalid id */
			while (1)
			{
				if (GL_TRUE != gl.isTexture(invalid_id))
				{
					break;
				}

				invalid_id += 1;
			}

			/* Invalidate the entry */
			t_sampler_ids[validated_index] = invalid_id;

			/* Test */
			gl.bindTextures(first, count, t_sampler_ids);
			CHECK_ERROR(GL_INVALID_OPERATION, "BindSamplers with invalid sampler id");
		}
	}
	catch (const std::exception&)
	{
		gl.deleteSamplers(n_samplers, sampler_ids);

		TCU_FAIL("Invalid error generated");
	}

	/* Delete samplers */
	gl.deleteSamplers(n_samplers, sampler_ids);

	/* Set result */
	m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

	/* Done */
	return tcu::TestNode::STOP;
}